

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  double *pdVar1;
  PositionType minPosition;
  PositionType maxPosition;
  bool bVar2;
  long lVar3;
  int iVar4;
  Particle *pPVar5;
  pointer pPVar6;
  byte bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ParticleArray particlesCopy;
  PositionType position_1;
  ParticleArray particles;
  ParticleType particle;
  vector<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
  local_e8;
  AssertionResult local_c8;
  undefined8 local_b8;
  AssertHelper local_b0;
  vector<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
  local_a8;
  long *local_90 [2];
  AssertHelper local_80;
  Particle local_78;
  
  bVar7 = 0;
  local_a8.
  super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Particle<(pica::Dimension)3> *)0x0;
  local_a8.
  super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Particle<(pica::Dimension)3> *)0x0;
  iVar4 = 0xd;
  do {
    local_e8.
    super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0xc024000000000000;
    local_e8.
    super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc024000000000000;
    local_e8.
    super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xc024000000000000;
    local_c8._0_8_ = (char *)0x4024000000000000;
    local_c8.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4024000000000000;
    local_b8 = 0x4024000000000000;
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    minPosition.z = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    maxPosition.z = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_78,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,
               minPosition,maxPosition);
    if (local_a8.
        super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_a8.
        super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<pica::Particle<(pica::Dimension)3>,std::allocator<pica::Particle<(pica::Dimension)3>>>
      ::_M_realloc_insert<pica::Particle<(pica::Dimension)3>const&>
                ((vector<pica::Particle<(pica::Dimension)3>,std::allocator<pica::Particle<(pica::Dimension)3>>>
                  *)&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_78);
    }
    else {
      pPVar5 = &local_78;
      pPVar6 = local_a8.
               super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        (pPVar6->position).x = (pPVar5->position).x;
        pPVar5 = (Particle *)((long)pPVar5 + (ulong)bVar7 * -0x10 + 8);
        pPVar6 = (Particle<(pica::Dimension)3> *)((long)pPVar6 + (ulong)bVar7 * -0x10 + 8);
      }
      local_a8.
      super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_a8.
           super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if ((((local_78.position.x !=
           local_a8.
           super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].position.x) ||
         (NAN(local_78.position.x) ||
          NAN(local_a8.
              super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].position.x))) ||
        (pdVar1 = &local_a8.
                   super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].position.y,
        local_78.position.y != *pdVar1)) ||
       (((NAN(local_78.position.y) || NAN(*pdVar1) ||
         (pdVar1 = &local_a8.
                    super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].position.z,
         local_78.position.z != *pdVar1)) || (NAN(local_78.position.z) || NAN(*pdVar1))))) {
LAB_0019d8e7:
      local_e8.
      super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_e8.
                            super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_ << 8);
LAB_0019d8f5:
      local_e8.
      super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      testing::Message::Message((Message *)local_90);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_c8,(AssertionResult *)&local_e8,
                 "this->eqParticles_(particle, particles.back())","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x67,(char *)local_c8._0_8_);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if ((char *)local_c8._0_8_ != (char *)0x0) {
        operator_delete__((void *)local_c8._0_8_);
      }
      if (((local_90[0] != (long *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_90[0] != (long *)0x0)) {
        (**(code **)(*local_90[0] + 8))();
      }
    }
    else {
      dVar8 = *(double *)(pica::ParticleTypes::types + (long)local_78.typeIndex * 0x10);
      lVar3 = (long)local_a8.
                    super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].typeIndex * 0x10;
      dVar9 = *(double *)(pica::ParticleTypes::types + lVar3);
      if (((((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) ||
           ((dVar10 = local_78.p.x * 29979245800.0 * dVar8,
            dVar11 = local_a8.
                     super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].p.x * 29979245800.0 * dVar9,
            dVar10 != dVar11 ||
            (((NAN(dVar10) || NAN(dVar11) ||
              (dVar10 = local_78.p.y * 29979245800.0 * dVar8,
              dVar11 = local_a8.
                       super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].p.y * 29979245800.0 * dVar9,
              dVar10 != dVar11)) || (NAN(dVar10) || NAN(dVar11))))))) ||
          ((dVar8 = local_78.p.z * 29979245800.0 * dVar8,
           dVar9 = local_a8.
                   super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].p.z * 29979245800.0 * dVar9,
           dVar8 != dVar9 || (NAN(dVar8) || NAN(dVar9))))) ||
         ((dVar8 = *(double *)(pica::ParticleTypes::types + 8 + (long)local_78.typeIndex * 0x10),
          pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar3), dVar8 != *pdVar1 ||
          (NAN(dVar8) || NAN(*pdVar1))))) goto LAB_0019d8e7;
      dVar8 = local_a8.
              super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].factor;
      local_e8.
      super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_e8.
                             super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_78.factor == dVar8);
      local_e8.
      super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((local_78.factor != dVar8) || (NAN(local_78.factor) || NAN(dVar8))) goto LAB_0019d8f5;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_e8.
              super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::
    vector<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
    ::vector(&local_e8,&local_a8);
    pdVar1 = (double *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_e8.
                            super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -0x60))->field_2 + 8);
    if ((((local_78.position.x != *pdVar1) || (NAN(local_78.position.x) || NAN(*pdVar1))) ||
        ((local_78.position.y !=
          (double)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_e8.
                          super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -0x40))->_M_dataplus)._M_p ||
         ((NAN(local_78.position.y) ||
           NAN((double)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)local_e8.
                               super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + -0x40))->_M_dataplus).
                       _M_p) ||
          (local_78.position.z !=
           (double)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)local_e8.
                          super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -0x40))->_M_string_length))))
        )) || (NAN(local_78.position.z) ||
               NAN((double)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)local_e8.
                                  super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -0x40))->
                           _M_string_length))) {
LAB_0019db04:
      local_c8._0_8_ = (ulong)(uint7)local_c8._1_7_ << 8;
LAB_0019db12:
      local_c8.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)local_90,&local_c8,"this->eqParticles_(particle, particlesCopy.back())"
                 ,"false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x69,(char *)local_90[0]);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_90[0] != (long *)0x0) {
        operator_delete__(local_90[0]);
      }
      if (((local_b0.data_ != (AssertHelperData *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b0.data_ + 8))();
      }
    }
    else {
      dVar8 = *(double *)(pica::ParticleTypes::types + (long)local_78.typeIndex * 0x10);
      lVar3 = (long)*(short *)((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)local_e8.
                                                 super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + -0x20)
                                      )->field_2 + 8) * 0x10;
      dVar9 = *(double *)(pica::ParticleTypes::types + lVar3);
      if ((((((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) ||
            (dVar10 = local_78.p.x * 29979245800.0 * dVar8,
            dVar11 = *(double *)
                      &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)local_e8.
                              super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -0x40))->field_2 *
                     29979245800.0 * dVar9, dVar10 != dVar11)) ||
           ((NAN(dVar10) || NAN(dVar11) ||
            (dVar10 = local_78.p.y * 29979245800.0 * dVar8,
            dVar11 = *(double *)
                      ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)local_e8.
                                     super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x40))->field_2 +
                      8) * 29979245800.0 * dVar9, dVar10 != dVar11)))) ||
          ((NAN(dVar10) || NAN(dVar11) ||
           ((dVar8 = local_78.p.z * 29979245800.0 * dVar8,
            dVar9 = (double)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)local_e8.
                                    super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -0x20))->
                            _M_dataplus)._M_p * 29979245800.0 * dVar9, dVar8 != dVar9 ||
            (NAN(dVar8) || NAN(dVar9))))))) ||
         ((dVar8 = *(double *)(pica::ParticleTypes::types + 8 + (long)local_78.typeIndex * 0x10),
          pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar3), dVar8 != *pdVar1 ||
          (NAN(dVar8) || NAN(*pdVar1))))) goto LAB_0019db04;
      dVar8 = (double)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)local_e8.
                             super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -0x20))->_M_string_length;
      local_c8.success_ = local_78.factor == dVar8;
      local_c8.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((local_78.factor != dVar8) || (NAN(local_78.factor) || NAN(dVar8))) goto LAB_0019db12;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_c8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_e8.
        super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.
                      super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      if (local_a8.
          super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}